

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * anon_unknown.dwarf_13465d::CheckType(ExpressionContext *ctx,ExprBase *expr,VmValue *value)

{
  VmType VVar1;
  
  VVar1 = GetVmType(ctx,expr->type);
  if (((value->type).type == VVar1.type) && ((value->type).size == VVar1.size)) {
    if (VVar1.structType == (value->type).structType) {
      return value;
    }
    __assert_fail("exprType.structType == value->type.structType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x1b,
                  "VmValue *(anonymous namespace)::CheckType(ExpressionContext &, ExprBase *, VmValue *)"
                 );
  }
  __assert_fail("exprType == value->type",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x1a,
                "VmValue *(anonymous namespace)::CheckType(ExpressionContext &, ExprBase *, VmValue *)"
               );
}

Assistant:

VmValue* CheckType(ExpressionContext &ctx, ExprBase* expr, VmValue *value)
	{
		VmType exprType = GetVmType(ctx, expr->type);

		(void)exprType;

		assert(exprType == value->type);
		assert(exprType.structType == value->type.structType);

		return value;
	}